

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int invokeValueDestructor(void *p,_func_void_void_ptr *xDel,sqlite3_context *pCtx)

{
  sqlite3_context *pCtx_local;
  _func_void_void_ptr *xDel_local;
  void *p_local;
  
  if ((xDel != (_func_void_void_ptr *)0x0) && (xDel != (_func_void_void_ptr *)0xffffffffffffffff)) {
    (*xDel)(p);
  }
  if (pCtx != (sqlite3_context *)0x0) {
    sqlite3_result_error_toobig(pCtx);
  }
  return 0x12;
}

Assistant:

static int invokeValueDestructor(
  const void *p,             /* Value to destroy */
  void (*xDel)(void*),       /* The destructor */
  sqlite3_context *pCtx      /* Set a SQLITE_TOOBIG error if no NULL */
){
  assert( xDel!=SQLITE_DYNAMIC );
  if( xDel==0 ){
    /* noop */
  }else if( xDel==SQLITE_TRANSIENT ){
    /* noop */
  }else{
    xDel((void*)p);
  }
  if( pCtx ) sqlite3_result_error_toobig(pCtx);
  return SQLITE_TOOBIG;
}